

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

_Bool fp_access_check(DisasContext_conflict1 *s)

{
  uint32_t target_el;
  
  if (s->fp_access_checked != true) {
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,target_el);
    }
    return target_el == 0;
  }
  __assert_fail("!s->fp_access_checked",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x487,"_Bool fp_access_check(DisasContext *)");
}

Assistant:

static inline bool fp_access_check(DisasContext *s)
{
    assert(!s->fp_access_checked);
    s->fp_access_checked = true;

    if (!s->fp_excp_el) {
        return true;
    }

    gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                       syn_fp_access_trap(1, 0xe, false), s->fp_excp_el);
    return false;
}